

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string.hpp
# Opt level: O2

string * util::slugize_str(string *__return_storage_ptr__,string *__str)

{
  char cVar1;
  pointer pcVar2;
  __type_conflict _Var3;
  int iVar4;
  reference pvVar5;
  int _char_index;
  long lVar6;
  ulong __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _words;
  string _slug;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  _slug._M_dataplus._M_p = (pointer)&_slug.field_2;
  _slug._M_string_length = 0;
  _slug.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_50,(string *)__str);
  std::__cxx11::string::string((string *)&local_70,"[^A-Za-z0-9]",(allocator *)&local_90);
  split(&_words,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      _words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__str);
  }
  else {
    for (__n = 0; __n < (ulong)((long)_words.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)_words.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1
        ) {
      lVar6 = 0;
      while( true ) {
        pcVar2 = _words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[__n]._M_dataplus._M_p;
        cVar1 = pcVar2[lVar6];
        if (cVar1 == '\0') break;
        iVar4 = tolower((int)cVar1);
        pcVar2[lVar6] = (char)iVar4;
        lVar6 = lVar6 + 1;
      }
      if (_words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[__n]._M_string_length != 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&_words,__n);
        _Var3 = std::operator==(pvVar5,_words.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        if ((!_Var3) ||
           ((long)_words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)_words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&_words,__n);
          _Var3 = std::operator==(pvVar5,_words.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -1);
          if (!_Var3) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&_words,__n);
            _Var3 = std::operator==(pvVar5,_words.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
            if (_Var3) {
              std::operator+(&local_90,
                             _words.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + __n,"-");
              std::__cxx11::string::append((string *)&_slug);
            }
            else {
              std::operator+(&local_90,
                             _words.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + __n,"-");
              std::__cxx11::string::append((string *)&_slug);
            }
            std::__cxx11::string::~string((string *)&local_90);
            goto LAB_00106140;
          }
        }
        std::__cxx11::string::append((string *)&_slug);
      }
LAB_00106140:
    }
    if (_slug._M_dataplus._M_p[_slug._M_string_length - 1] == '-') {
      std::__cxx11::string::erase((ulong)&_slug,_slug._M_string_length - 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_slug._M_dataplus._M_p == &_slug.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(_slug.field_2._M_allocated_capacity._1_7_,_slug.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = _slug.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = _slug._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(_slug.field_2._M_allocated_capacity._1_7_,_slug.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = _slug._M_string_length;
    _slug._M_string_length = 0;
    _slug.field_2._M_local_buf[0] = '\0';
    _slug._M_dataplus._M_p = (pointer)&_slug.field_2;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&_words);
  std::__cxx11::string::~string((string *)&_slug);
  return __return_storage_ptr__;
}

Assistant:

std::string slugize_str(std::string __str) {
		std::string _slug;
		std::vector<std::string> _words = split(__str, "[^A-Za-z0-9]");

		if (_words.empty())
			return __str;
		
		for (int _word_index = 0; (unsigned int) _word_index < _words.size(); _word_index++) {
			for (int _char_index = 0; _words[_word_index][_char_index]; _char_index++)
				_words[_word_index][_char_index] = tolower(_words[_word_index][_char_index]);

			if (_words[_word_index].empty())
				continue;
			else if ((_words.at(_word_index) == _words.front() && _words.size() == 1) || _words.at(_word_index) == _words.back())
				_slug += _words[_word_index];
			else if (_words.at(_word_index) == _words.front())
				_slug += _words[_word_index] + "-";
			else
				_slug += _words[_word_index] + "-";
		}

		// in case the last caught member is a non-alphanumeric character
		if (_slug.back() == '-')
			_slug.erase(_slug.size() - 1);

		return _slug;
	}